

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.h
# Opt level: O3

t_pvalue __thiscall
xemmai::t_derived_primitive<long>::f_do_construct
          (t_derived_primitive<long> *this,t_pvalue *a_stack,size_t a_n)

{
  t_heap<xemmai::t_object> *this_00;
  ulong uVar1;
  undefined8 uVar2;
  long lVar3;
  t_queue<128UL> *this_01;
  t_queue<256UL> *this_02;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  t_object *p;
  t_object *ptVar6;
  t_object *ptVar7;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar8;
  long lVar9;
  char *pcVar10;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar11;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX_00;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX_01;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 extraout_RDX_02;
  size_t a_size;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  t_pvalue tVar14;
  
  uVar1 = *(ulong *)(a_n + 0x20);
  if ((uVar1 != 3) &&
     ((((uVar1 < 3 || (uVar1 == 4)) || (*(long *)(*(long *)(uVar1 + 0x40) + 8) == 0)) ||
      (*(undefined8 **)(*(long *)(*(long *)(uVar1 + 0x40) + 0x10) + 8) != &v__type_id<long>)))) {
    f_do_construct();
  }
  aVar11.v_integer = a_n + 0x28;
  aVar8.v_integer = uVar1 + 0x48;
  if (uVar1 < 5) {
    aVar8.v_integer = aVar11.v_integer;
  }
  uVar2 = *(undefined8 *)aVar8;
  this_00 = (t_heap<xemmai::t_object> *)(*(long *)(in_FS_OFFSET + -0x60) + 0x30);
  a_size = a_stack[3].field_0.v_integer * 0x10 + 0x50;
  if (a_size < 0x81) {
    ptVar7 = *(t_object **)(in_FS_OFFSET + -0x58);
    if (ptVar7 == (t_object *)0x0) {
      ptVar7 = t_heap<xemmai::t_object>::t_of<0UL,_65536UL>::f_allocate
                         ((t_of<0UL,_65536UL> *)(*(long *)(in_FS_OFFSET + -0x60) + 0x90),this_00);
      ptVar6 = ptVar7->v_next;
      aVar11 = extraout_RDX_02;
    }
    else {
      ptVar6 = ptVar7->v_next;
    }
    *(t_object **)(in_FS_OFFSET + -0x58) = ptVar6;
  }
  else {
    ptVar7 = t_heap<xemmai::t_object>::f_allocate_medium(this_00,a_size);
    aVar11 = extraout_RDX;
  }
  ptVar7->v_next = (t_object *)0x0;
  auVar5 = _DAT_0017f0d0;
  auVar4 = _DAT_0017f0c0;
  lVar3 = a_stack[3].field_0.v_integer;
  if (lVar3 != 0) {
    lVar9 = lVar3 + -1;
    auVar12._8_4_ = (int)lVar9;
    auVar12._0_8_ = lVar9;
    auVar12._12_4_ = (int)((ulong)lVar9 >> 0x20);
    pcVar10 = ptVar7->v_data + 0x18;
    aVar11.v_integer = 0;
    auVar12 = auVar12 ^ _DAT_0017f0d0;
    do {
      auVar13._8_4_ = (int)aVar11.v_integer;
      auVar13._0_8_ = aVar11.v_integer;
      auVar13._12_4_ = (int)((ulong)aVar11 >> 0x20);
      auVar13 = (auVar13 | auVar4) ^ auVar5;
      if ((bool)(~(auVar13._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar13._0_4_ ||
                  auVar12._4_4_ < auVar13._4_4_) & 1)) {
        pcVar10[-0x10] = '\0';
        pcVar10[-0xf] = '\0';
        pcVar10[-0xe] = '\0';
        pcVar10[-0xd] = '\0';
        pcVar10[-0xc] = '\0';
        pcVar10[-0xb] = '\0';
        pcVar10[-10] = '\0';
        pcVar10[-9] = '\0';
      }
      if ((auVar13._12_4_ != auVar12._12_4_ || auVar13._8_4_ <= auVar12._8_4_) &&
          auVar13._12_4_ <= auVar12._12_4_) {
        pcVar10[0] = '\0';
        pcVar10[1] = '\0';
        pcVar10[2] = '\0';
        pcVar10[3] = '\0';
        pcVar10[4] = '\0';
        pcVar10[5] = '\0';
        pcVar10[6] = '\0';
        pcVar10[7] = '\0';
      }
      aVar11.v_integer = aVar11.v_integer + 2;
      pcVar10 = pcVar10 + 0x20;
    } while ((undefined8 *)(lVar3 + 1U & 0xfffffffffffffffe) != (undefined8 *)aVar11.v_integer);
  }
  *(undefined8 *)ptVar7->v_data = uVar2;
  this_01 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
  *this_01->v_head = (t_object *)&a_stack[-5].field_0;
  if (this_01->v_head == this_01->v_next) {
    t_slot::t_queue<128UL>::f_next(this_01);
    aVar11 = extraout_RDX_00;
  }
  else {
    this_01->v_head = this_01->v_head + 1;
  }
  ptVar7->v_type = (t_type *)a_stack;
  this_02 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
  *this_02->v_head = ptVar7;
  if (this_02->v_head == this_02->v_next) {
    t_slot::t_queue<256UL>::f_next(this_02);
    aVar11 = extraout_RDX_01;
  }
  else {
    this_02->v_head = this_02->v_head + 1;
  }
  (this->super_t_derived<xemmai::t_type_of<long>_>).super_t_type_of<long>.
  super_t_derivable<xemmai::t_bears<long,_xemmai::t_type_of<xemmai::t_object>_>,_xemmai::t_derived_primitive<long>_>
  .super_t_bears<long,_xemmai::t_type_of<xemmai::t_object>_>.
  super_t_derives<long,_xemmai::t_type_of<xemmai::t_object>_>.super_t_type_of<xemmai::t_object>.
  v_this = (t_slot)ptVar7;
  tVar14.field_0.v_integer = aVar11.v_integer;
  tVar14.super_t_pointer.v_p = (t_object *)this;
  return tVar14;
}

Assistant:

t_pvalue f_do_construct(t_pvalue* a_stack, size_t a_n)
	{
		f_check<T>(a_stack[2], L"argument0");
		return this->template f_new<T>(f_as<T>(a_stack[2]));
	}